

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O3

BaseFab<amrex::EBCellFlag> * __thiscall
amrex::BaseFab<amrex::EBCellFlag>::copy<(amrex::RunOn)0>
          (BaseFab<amrex::EBCellFlag> *this,BaseFab<amrex::EBCellFlag> *src,Box *srcbox,int srccomp,
          Box *destbox,int destcomp,int numcomp)

{
  Box *pBVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  anon_class_152_5_d58b1f45 local_c8;
  
  pBVar1 = &this->domain;
  local_c8.d.begin.x = (pBVar1->smallend).vect[0];
  local_c8.d.begin.y = (pBVar1->smallend).vect[1];
  lVar6 = (long)(this->domain).bigend.vect[1] + 1;
  lVar5 = (long)(this->domain).bigend.vect[0];
  local_c8.d.jstride = (lVar5 - (pBVar1->smallend).vect[0]) + 1;
  local_c8.d.end._0_8_ = lVar5 + 1U & 0xffffffff | lVar6 << 0x20;
  pBVar1 = &src->domain;
  local_c8.s.begin.x = (pBVar1->smallend).vect[0];
  local_c8.s.begin.y = (pBVar1->smallend).vect[1];
  lVar7 = (long)(src->domain).bigend.vect[1] + 1;
  iVar4 = (src->domain).bigend.vect[0];
  local_c8.s.jstride = ((long)iVar4 - (long)(pBVar1->smallend).vect[0]) + 1;
  local_c8.s.end._0_8_ = (ulong)(iVar4 + 1) | lVar7 << 0x20;
  local_c8.s.p = src->dptr;
  local_c8.s.ncomp = src->nvar;
  local_c8.s.begin.z = (src->domain).smallend.vect[2];
  local_c8.offset.z = (srcbox->smallend).vect[2] - (destbox->smallend).vect[2];
  local_c8.d.p = this->dptr;
  local_c8.d.ncomp = this->nvar;
  local_c8.d.begin.z = (this->domain).smallend.vect[2];
  local_c8.d.kstride = (lVar6 - (this->domain).smallend.vect[1]) * local_c8.d.jstride;
  lVar5 = (long)(this->domain).bigend.vect[2] + 1;
  local_c8.d.nstride = (lVar5 - local_c8.d.begin.z) * local_c8.d.kstride;
  local_c8.d.end.z = (int)lVar5;
  lVar5 = (long)(src->domain).bigend.vect[2] + 1;
  local_c8.s.kstride = (lVar7 - (src->domain).smallend.vect[1]) * local_c8.s.jstride;
  local_c8.s.nstride = (lVar5 - local_c8.s.begin.z) * local_c8.s.kstride;
  local_c8.s.end.z = (int)lVar5;
  uVar2 = *(undefined8 *)(srcbox->smallend).vect;
  uVar3 = *(undefined8 *)(destbox->smallend).vect;
  local_c8.offset.x = (int)uVar2 - (int)uVar3;
  local_c8.offset.y = (int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar3 >> 0x20);
  local_c8.destcomp = destcomp;
  local_c8.srccomp = srccomp;
  LoopConcurrentOnCpu<amrex::BaseFab<amrex::EBCellFlag>::copy<(amrex::RunOn)0>(amrex::BaseFab<amrex::EBCellFlag>const&,amrex::Box_const&,int,amrex::Box_const&,int,int)::_lambda(int,int,int,int)_1_>
            (destbox,numcomp,&local_c8);
  return this;
}

Assistant:

BaseFab<T>&
BaseFab<T>::copy (const BaseFab<T>& src, const Box& srcbox, int srccomp,
                  const Box& destbox, int destcomp, int numcomp) noexcept
{
    AMREX_ASSERT(destbox.ok());
    AMREX_ASSERT(srcbox.sameSize(destbox));
    AMREX_ASSERT(src.box().contains(srcbox));
    AMREX_ASSERT(this->domain.contains(destbox));
    AMREX_ASSERT(srccomp >= 0 && srccomp+numcomp <= src.nComp());
    AMREX_ASSERT(destcomp >= 0 && destcomp+numcomp <= this->nvar);

    Array4<T> const& d = this->array();
    Array4<T const> const& s = src.const_array();
    const auto dlo = amrex::lbound(destbox);
    const auto slo = amrex::lbound(srcbox);
    const Dim3 offset{slo.x-dlo.x,slo.y-dlo.y,slo.z-dlo.z};

    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(run_on, destbox, numcomp, i, j, k, n,
    {
        d(i,j,k,n+destcomp) = s(i+offset.x,j+offset.y,k+offset.z,n+srccomp);
    });

    return *this;
}